

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
::clear(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
        *this)

{
  ulong uVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        lVar2 = 8;
        for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
          if (-1 < this->ctrl_[uVar3]) {
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
            ::~raw_hash_set((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                             *)((long)this->slots_ + lVar2));
            uVar1 = this->capacity_;
          }
          lVar2 = lVar2 + 0x38;
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[this->capacity_] = -1;
        reset_growth_left(this);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x4c3,
                    "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::clear() [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }